

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

image * __thiscall basisu::image::swap(image *this,image *other)

{
  uint32_t uVar1;
  
  uVar1 = this->m_width;
  this->m_width = other->m_width;
  other->m_width = uVar1;
  uVar1 = this->m_height;
  this->m_height = other->m_height;
  other->m_height = uVar1;
  uVar1 = this->m_pitch;
  this->m_pitch = other->m_pitch;
  other->m_pitch = uVar1;
  vector<basisu::color_rgba>::swap(&this->m_pixels,&other->m_pixels);
  return this;
}

Assistant:

image &swap(image &other)
		{
			std::swap(m_width, other.m_width);
			std::swap(m_height, other.m_height);
			std::swap(m_pitch, other.m_pitch);
			m_pixels.swap(other.m_pixels);
			return *this;
		}